

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

void icetStateResetTiming(void)

{
  icetStateSetDouble(0xc1,0.0);
  icetStateSetDouble(0xc2,0.0);
  icetStateSetDouble(0xc3,0.0);
  icetStateSetDouble(0xc4,0.0);
  icetStateSetDouble(0xc5,0.0);
  icetStateSetDouble(0xc6,0.0);
  icetStateSetDouble(199,0.0);
  icetStateSetDouble(200,0.0);
  icetStateSetInteger(0xd1,0);
  icetStateSetInteger(0xd3,0);
  icetStateSetInteger(0xc9,0);
  return;
}

Assistant:

void icetStateResetTiming(void)
{
    icetStateSetDouble(ICET_RENDER_TIME, 0.0);
    icetStateSetDouble(ICET_BUFFER_READ_TIME, 0.0);
    icetStateSetDouble(ICET_BUFFER_WRITE_TIME, 0.0);
    icetStateSetDouble(ICET_COMPRESS_TIME, 0.0);
    icetStateSetDouble(ICET_BLEND_TIME, 0.0);
    icetStateSetDouble(ICET_COMPOSITE_TIME, 0.0);
    icetStateSetDouble(ICET_COLLECT_TIME, 0.0);
    icetStateSetDouble(ICET_TOTAL_DRAW_TIME, 0.0);

    icetStateSetInteger(ICET_DRAW_TIME_ID, 0);
    icetStateSetInteger(ICET_SUBFUNC_TIME_ID, 0);

    icetStateSetInteger(ICET_BYTES_SENT, 0);
}